

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void custom_background(bool status,int color)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  undefined7 in_register_00000039;
  uint __len;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((int)CONCAT71(in_register_00000039,status) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[48;5;0m",9);
    return;
  }
  __val = -color;
  if (0 < color) {
    __val = color;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001125b3;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001125b3;
      }
      if (uVar3 < 10000) goto LAB_001125b3;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_001125b3:
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)__len - (char)(color >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_48[0] + ((uint)color >> 0x1f),__len,__val);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x115a23);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_68,local_60);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void custom_background(bool status,int color){
	if (status == true) cout<<"\033[48;5;"+to_string(color)+"m";
	else cout<<"\033[48;5;0m";
}